

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_2ddrawer.cpp
# Opt level: O2

void __thiscall
F2DDrawer::AddLine(F2DDrawer *this,int x1,int y1,int x2,int y2,int palcolor,uint32 color)

{
  FSimpleVertex *pFVar1;
  int *piVar2;
  FSimpleVertex *pFVar3;
  int iVar4;
  uint uVar5;
  DataGeneric dg;
  
  if (color == 0) {
    color = GPalette.BaseColors[palcolor].field_0.d;
  }
  dg.mType = DrawTypeLine;
  dg.mLen = 0x10;
  dg.mVertCount = 2;
  dg.mVertIndex = TArray<FSimpleVertex,_FSimpleVertex>::Reserve(&this->mVertices,2);
  pFVar3 = (this->mVertices).Array;
  pFVar1 = pFVar3 + dg.mVertIndex;
  pFVar1->x = (float)x1;
  pFVar1->z = (float)y1;
  pFVar1->y = 0.0;
  pFVar1->u = 0.0;
  pFVar3[dg.mVertIndex].v = 0.0;
  uVar5 = color >> 0x10 & 0xff | color & 0xff00 | color << 0x10 | 0xff000000;
  pFVar3[dg.mVertIndex].color.field_0.d = uVar5;
  pFVar3 = (this->mVertices).Array;
  pFVar1 = pFVar3 + (long)dg.mVertIndex + 1;
  pFVar1->x = (float)x2;
  pFVar1->z = (float)y2;
  pFVar1->y = 0.0;
  pFVar1->u = 0.0;
  pFVar3[(long)dg.mVertIndex + 1].v = 0.0;
  pFVar3[(long)dg.mVertIndex + 1].color.field_0.d = uVar5;
  if ((long)this->mLastLineCmd == -1) {
    iVar4 = AddData(this,&dg);
    this->mLastLineCmd = iVar4;
  }
  else {
    piVar2 = (int *)((this->mData).Array + (long)this->mLastLineCmd + 0xc);
    *piVar2 = *piVar2 + 2;
  }
  return;
}

Assistant:

void F2DDrawer::AddLine(int x1, int y1, int x2, int y2, int palcolor, uint32 color)
{
	PalEntry p = color ? (PalEntry)color : GPalette.BaseColors[palcolor];
	p.a = 255;
	std::swap(p.r, p.b);

	DataGeneric dg;

	dg.mType = DrawTypeLine;
	dg.mLen = (sizeof(dg) + 7) & ~7;
	dg.mVertCount = 2;
	dg.mVertIndex = (int)mVertices.Reserve(2);
	mVertices[dg.mVertIndex].Set(x1, y1, 0, 0, 0, p);
	mVertices[dg.mVertIndex+1].Set(x2, y2, 0, 0, 0, p);

	// Test if we can batch multiple line commands
	if (mLastLineCmd == -1)
	{
		mLastLineCmd = AddData(&dg);
	}
	else
	{
		DataGeneric *dg = (DataGeneric *)&mData[mLastLineCmd];
		dg->mVertCount += 2;
	}
}